

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::evaluateCollocationConstraint
          (ForwardEuler *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *constraintValue)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  char *pcVar6;
  VectorDynSize *vec;
  element_type *peVar7;
  VectorDynSize *pVVar8;
  const_reference pvVar9;
  ulong in_RCX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RDX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_stack_fffffffffffffa78;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffaa0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffaa8;
  StorageBaseType *in_stack_fffffffffffffac0;
  double *in_stack_fffffffffffffac8;
  string local_378 [32];
  ostringstream local_358 [376];
  string local_1e0 [48];
  ostringstream local_1b0 [376];
  ulong local_38;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_28;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_20;
  undefined8 local_18;
  byte local_1;
  
  local_38 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (bVar1) {
    sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (local_20);
    if (sVar4 == 2) {
      sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                        (local_28);
      if (sVar4 == 0) {
        std::__cxx11::ostringstream::ostringstream(local_358);
        std::operator<<((ostream *)local_358,
                        "The size of the matrix containing the control inputs does not match the expected one. Input = "
                       );
        sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                          (local_28);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_358,sVar4);
        std::operator<<(poVar5,", Expected = 1 (at least).");
        IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a7ece);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError(pcVar3,"evaluateCollocationConstraint",pcVar6);
        std::__cxx11::string::~string(local_378);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_358);
      }
      else {
        vec = (VectorDynSize *)iDynTree::VectorDynSize::size();
        peVar7 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3a7fae);
        pVVar8 = (VectorDynSize *)DynamicalSystem::stateSpaceSize(peVar7);
        if (vec != pVVar8) {
          peVar7 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x3a7fde);
          DynamicalSystem::stateSpaceSize(peVar7);
          iDynTree::VectorDynSize::resize(local_38);
        }
        peVar7 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3a8002);
        pvVar9 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                 operator[](local_28,0);
        uVar2 = (*peVar7->_vptr_DynamicalSystem[3])(peVar7,pvVar9);
        if ((uVar2 & 1) == 0) {
          IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a8038);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError
                    (pcVar3,"evaluateCollocationConstraint","Error while setting the control input."
                    );
          local_1 = 0;
        }
        else {
          peVar7 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x3a8071);
          pvVar9 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                   operator[](local_20,0);
          uVar2 = (*peVar7->_vptr_DynamicalSystem[2])(local_18,peVar7,pvVar9,in_RDI + 0x58);
          if ((uVar2 & 1) == 0) {
            IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a80b9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iDynTree::reportError
                      (pcVar3,"evaluateCollocationConstraint",
                       "Error while evaluating the dynamical system.");
            local_1 = 0;
          }
          else {
            std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_20,1);
            toEigen(vec);
            Eigen::
            DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            ::operator-((DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)vec);
            std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_20,0);
            toEigen(vec);
            Eigen::
            MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>
            ::operator+((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                         *)in_stack_fffffffffffffaa8,
                        (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)in_stack_fffffffffffffaa0);
            toEigen(vec);
            Eigen::operator*(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>
            ::operator+(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
            toEigen(vec);
            Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                      ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                       peVar7,in_stack_fffffffffffffa78);
            local_1 = 1;
          }
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::operator<<((ostream *)local_1b0,
                      "The size of the matrix containing the collocation point does not match the expected one. Input = "
                     );
      sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                        (local_20);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,sVar4);
      std::operator<<(poVar5,", Expected = 2.");
      IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a7d8d);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar3,"evaluateCollocationConstraint",pcVar6);
      std::__cxx11::string::~string(local_1e0);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
  }
  else {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a7ce1);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"evaluateCollocationConstraint","Dynamical system not set.");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraint(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                             const std::vector<VectorDynSize> &controlInputs,
                                                             double dT, VectorDynSize &constraintValue)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() < 1){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 1 (at least).";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (constraintValue.size() != m_dynamicalSystem_ptr->stateSpaceSize()) {
                    constraintValue.resize(static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize()));
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamics(collocationPoints[0], time, m_computationBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while evaluating the dynamical system.");
                    return false;
                }

                toEigen(constraintValue) = -toEigen(collocationPoints[1]) + toEigen(collocationPoints[0]) +
                        dT*toEigen(m_computationBuffer);

                return true;
            }